

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_table(LexState *ls,ExpDesc *e)

{
  BCLine line_00;
  BCReg BVar1;
  uint uVar2;
  FuncState *fs_00;
  uint64_t uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BCPos BVar7;
  int iVar8;
  LexToken LVar9;
  BCReg BVar10;
  TValue *pTVar11;
  int local_1c0;
  int local_1bc;
  uint32_t local_1b0;
  uint32_t local_1ac;
  uint32_t local_1a4;
  Node *n;
  uint32_t hmask;
  uint32_t i;
  Node *node;
  BCIns *ip;
  ExpDesc en;
  BCInsLine *ilp;
  BCReg kidx;
  TValue *v;
  TValue k;
  ExpDesc val;
  ExpDesc key;
  BCPos pc;
  BCReg freg;
  uint32_t nhash;
  uint32_t narr;
  int fixt;
  int needarr;
  int vcall;
  GCtab *t;
  BCLine line;
  FuncState *fs;
  ExpDesc *e_local;
  LexState *ls_local;
  GCobj *o;
  
  fs_00 = ls->fs;
  line_00 = ls->linenumber;
  _needarr = (GCobj *)0x0;
  bVar5 = false;
  bVar4 = false;
  bVar6 = false;
  freg = 1;
  pc = 0;
  BVar1 = fs_00->freereg;
  BVar7 = bcemit_INS(fs_00,BVar1 << 8 | 0x34);
  e->k = VNONRELOC;
  (e->u).s.info = BVar1;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  bcreg_reserve(fs_00,1);
  lex_check(ls,0x7b);
  do {
    if (ls->tok == 0x7d) break;
    bVar5 = false;
    if (ls->tok == 0x5b) {
      expr_bracket(ls,(ExpDesc *)&val.f);
      if (4 < key.u.s.info) {
        expr_index(fs_00,e,(ExpDesc *)&val.f);
      }
      if ((key.u.s.info == 4) && (iVar8 = expr_numiszero((ExpDesc *)&val.f), iVar8 != 0)) {
        bVar4 = true;
      }
      else {
        pc = pc + 1;
      }
      lex_check(ls,0x3d);
    }
    else if (((ls->tok == 0x11f) || (ls->tok == 0x10a)) &&
            (LVar9 = lj_lex_lookahead(ls), LVar9 == 0x3d)) {
      expr_str(ls,(ExpDesc *)&val.f);
      lex_check(ls,0x3d);
      pc = pc + 1;
    }
    else {
      key.u.s.info = 4;
      val._16_8_ = (BADTYPE)(int)freg;
      freg = freg + 1;
      bVar5 = true;
      bVar4 = true;
    }
    expr(ls,(ExpDesc *)&k.gcr);
    if ((((uint)key.u._0_4_ < 5) && (key.u.s.info != 0)) &&
       ((key.u.s.info == 3 || (((uint)val.u._0_4_ < 5 && (val.u.s.aux == val.k)))))) {
      if (_needarr == (GCobj *)0x0) {
        if (bVar4) {
          local_1a4 = freg;
        }
        else {
          local_1a4 = 0;
        }
        if (pc == 0) {
          local_1b0 = 0;
        }
        else {
          if (pc == 1) {
            local_1ac = 1;
          }
          else {
            iVar8 = 0x1f;
            if (pc - 1 != 0) {
              for (; pc - 1 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            local_1ac = iVar8 + 1;
          }
          local_1b0 = local_1ac;
        }
        _needarr = (GCobj *)lj_tab_new(fs_00->L,local_1a4,local_1b0);
        BVar10 = const_gc(fs_00,_needarr,0xfffffff4);
        fs_00->bcbase[BVar7].ins = BVar1 * 0x100 | 0x35 | BVar10 << 0x10;
      }
      bVar5 = false;
      expr_kvalue(fs_00,(TValue *)&v,(ExpDesc *)&val.f);
      pTVar11 = lj_tab_set(fs_00->L,&_needarr->tab,(cTValue *)&v);
      if (((_needarr->gch).marked & 4) != 0) {
        uVar3 = (fs_00->L->glref).ptr64;
        (_needarr->gch).marked = (_needarr->gch).marked & 0xfb;
        (_needarr->gch).gclist.gcptr64 = *(uint64_t *)(uVar3 + 0x40);
        *(GCobj **)(uVar3 + 0x40) = _needarr;
      }
      if ((4 < val.u.s.info) || (val.u.s.aux != val.k)) {
        pTVar11->u64 = (ulong)_needarr | 0xfffa000000000000;
        bVar6 = true;
        goto LAB_001386fe;
      }
      expr_kvalue(fs_00,pTVar11,(ExpDesc *)&k.gcr);
    }
    else {
LAB_001386fe:
      if (val.u.s.info != 0xd) {
        expr_toanyreg(fs_00,(ExpDesc *)&k.gcr);
        bVar5 = false;
      }
      if (key.u.s.info < 5) {
        expr_index(fs_00,e,(ExpDesc *)&val.f);
      }
      bcemit_store(fs_00,e,(ExpDesc *)&k.gcr);
    }
    fs_00->freereg = BVar1 + 1;
    iVar8 = lex_opt(ls,0x2c);
  } while ((iVar8 != 0) || (iVar8 = lex_opt(ls,0x3b), iVar8 != 0));
  lex_match(ls,0x7d,0x7b,line_00);
  if (bVar5) {
    en._16_8_ = fs_00->bcbase + (fs_00->pc - 1);
    en.u.s.info = 4;
    en.u.s.aux = 0xffffffff;
    en.k = ~VKNIL;
    ip._0_4_ = freg - 1;
    ip._4_4_ = 0x43300000;
    if (0x100 < freg) {
      fs_00->pc = fs_00->pc - 1;
      en._16_8_ = en._16_8_ + -8;
    }
    BVar10 = const_num(fs_00,(ExpDesc *)&ip);
    *(BCReg *)en._16_8_ = (BVar1 + 1) * 0x100 | 0x3f | BVar10 << 0x10;
    *(undefined1 *)(en._16_8_ + -5) = 0;
  }
  if (BVar7 == fs_00->pc - 1) {
    (e->u).s.info = BVar7;
    fs_00->freereg = fs_00->freereg - 1;
    e->k = VRELOCABLE;
  }
  else {
    e->k = VNONRELOC;
  }
  if (_needarr == (GCobj *)0x0) {
    if (bVar4) {
      if (freg < 3) {
        freg._0_2_ = 3;
      }
      else {
        if (0x7ff < freg) {
          freg = 0x7ff;
        }
      }
    }
    else {
      freg._0_2_ = 0;
    }
    if (pc == 0) {
      local_1c0 = 0;
    }
    else {
      if (pc == 1) {
        local_1bc = 1;
      }
      else {
        local_1bc = 0x1f;
        if (pc - 1 != 0) {
          for (; pc - 1 >> local_1bc == 0; local_1bc = local_1bc + -1) {
          }
        }
        local_1bc = local_1bc + 1;
      }
      local_1c0 = local_1bc;
    }
    *(ushort *)((long)&fs_00->bcbase[BVar7].ins + 2) = (ushort)freg | (ushort)(local_1c0 << 0xb);
  }
  else {
    if ((bVar4) && ((_needarr->pt).sizekgc < freg)) {
      lj_tab_reasize(fs_00->L,&_needarr->tab,freg - 1);
    }
    if (bVar6) {
      pTVar11 = (_needarr->th).top;
      uVar2 = (_needarr->pt).sizekn;
      for (n._4_4_ = 0; n._4_4_ <= uVar2; n._4_4_ = n._4_4_ + 1) {
        if ((int)pTVar11[(ulong)n._4_4_ * 3].field_4.it >> 0xf == -0xc) {
          pTVar11[(ulong)n._4_4_ * 3].u64 = 0xffffffffffffffff;
        }
      }
    }
    if (*(ulong *)((fs_00->L->glref).ptr64 + 0x18) <= *(ulong *)((fs_00->L->glref).ptr64 + 0x10)) {
      lj_gc_step(fs_00->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->tok != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->tok == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(fs, &k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(fs, v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lj_assertFS(bc_a(ilp->ins) == freg &&
		bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB),
		"bad CALL code generation");
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lj_assertFS(tabV(&n->val) == t, "bad dummy key in template table");
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}